

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_2> __thiscall tcu::normalize<double,2>(tcu *this,Vector<double,_2> *a)

{
  Type TVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  Vector<double,_2> VVar4;
  int local_24;
  int i;
  double ooLen;
  Vector<double,_2> *a_local;
  Vector<double,_2> *res;
  
  TVar1 = length<double,2>(a);
  dVar2 = 1.0 / TVar1;
  Vector<double,_2>::Vector((Vector<double,_2> *)this);
  dVar3 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    dVar3 = dVar2 * a->m_data[local_24];
    *(double *)(this + (long)local_24 * 8) = dVar3;
  }
  VVar4.m_data[1] = TVar1;
  VVar4.m_data[0] = dVar3;
  return (Vector<double,_2>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}